

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_pulse.c
# Opt level: O1

pa_buffer_attr *
set_buffering_attribute
          (pa_buffer_attr *__return_storage_ptr__,uint latency_frames,pa_sample_spec *sample_spec)

{
  uint uVar1;
  size_t sVar2;
  uint uVar3;
  
  __return_storage_ptr__->maxlength = 0xffffffff;
  __return_storage_ptr__->prebuf = 0xffffffff;
  sVar2 = (*cubeb_pa_frame_size)(sample_spec);
  uVar1 = (int)sVar2 * latency_frames;
  __return_storage_ptr__->tlength = uVar1;
  uVar3 = uVar1 >> 2;
  __return_storage_ptr__->minreq = uVar3;
  __return_storage_ptr__->fragsize = uVar3;
  if ((g_cubeb_log_callback != (cubeb_log_callback)0x0) && (g_cubeb_log_level != CUBEB_LOG_DISABLED)
     ) {
    (*g_cubeb_log_callback)
              ("%s:%d: Requested buffer attributes maxlength %u, tlength %u, prebuf %u, minreq %u, fragsize %u\n"
               ,"cubeb_pulse.c",0x36f,0xffffffff,(ulong)uVar1,0xffffffff,(ulong)uVar3,(ulong)uVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

static pa_buffer_attr
set_buffering_attribute(unsigned int latency_frames, pa_sample_spec * sample_spec)
{
  pa_buffer_attr battr;
  battr.maxlength = -1;
  battr.prebuf    = -1;
  battr.tlength   = latency_frames * WRAP(pa_frame_size)(sample_spec);
  battr.minreq    = battr.tlength / 4;
  battr.fragsize  = battr.minreq;

  LOG("Requested buffer attributes maxlength %u, tlength %u, prebuf %u, minreq %u, fragsize %u",
      battr.maxlength, battr.tlength, battr.prebuf, battr.minreq, battr.fragsize);

  return battr;
}